

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O2

void web_server_accept(SOCKET lsock,fd_set *set)

{
  uint sock;
  int iVar1;
  uint *arg;
  int *piVar2;
  long lVar3;
  sockaddr_storage *psVar4;
  uint *puVar5;
  byte bVar6;
  socklen_t clientLen;
  char errorBuffer [256];
  sockaddr_storage clientAddr;
  
  bVar6 = 0;
  if ((lsock != -1) &&
     (((ulong)set->__fds_bits[lsock / 0x40] >> ((long)lsock % 0x40 & 0x3fU) & 1) != 0)) {
    clientLen = 0x80;
    sock = accept(lsock,(sockaddr *)&clientAddr,&clientLen);
    if (sock == 0xffffffff) {
      piVar2 = __errno_location();
      __xpg_strerror_r(*piVar2,errorBuffer,0x100);
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x211,
                 "miniserver: Error in accept(): %s\n",errorBuffer);
    }
    else {
      errorBuffer[0x20] = '\0';
      errorBuffer[0x21] = '\0';
      errorBuffer[0x22] = '\0';
      errorBuffer[0x23] = '\0';
      errorBuffer[0x24] = '\0';
      errorBuffer[0x25] = '\0';
      errorBuffer[0x26] = '\0';
      errorBuffer[0x27] = '\0';
      errorBuffer[0x28] = '\0';
      errorBuffer[0x29] = '\0';
      errorBuffer[0x2a] = '\0';
      errorBuffer[0x2b] = '\0';
      errorBuffer[0x2c] = '\0';
      errorBuffer[0x2d] = '\0';
      errorBuffer[0x2e] = '\0';
      errorBuffer[0x2f] = '\0';
      errorBuffer[0x10] = '\0';
      errorBuffer[0x11] = '\0';
      errorBuffer[0x12] = '\0';
      errorBuffer[0x13] = '\0';
      errorBuffer[0x14] = '\0';
      errorBuffer[0x15] = '\0';
      errorBuffer[0x16] = '\0';
      errorBuffer[0x17] = '\0';
      errorBuffer[0x18] = '\0';
      errorBuffer[0x19] = '\0';
      errorBuffer[0x1a] = '\0';
      errorBuffer[0x1b] = '\0';
      errorBuffer[0x1c] = '\0';
      errorBuffer[0x1d] = '\0';
      errorBuffer[0x1e] = '\0';
      errorBuffer[0x1f] = '\0';
      errorBuffer[0] = '\0';
      errorBuffer[1] = '\0';
      errorBuffer[2] = '\0';
      errorBuffer[3] = '\0';
      errorBuffer[4] = '\0';
      errorBuffer[5] = '\0';
      errorBuffer[6] = '\0';
      errorBuffer[7] = '\0';
      errorBuffer[8] = '\0';
      errorBuffer[9] = '\0';
      errorBuffer[10] = '\0';
      errorBuffer[0xb] = '\0';
      errorBuffer[0xc] = '\0';
      errorBuffer[0xd] = '\0';
      errorBuffer[0xe] = '\0';
      errorBuffer[0xf] = '\0';
      arg = (uint *)malloc(0x88);
      if (arg == (uint *)0x0) {
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1dd,
                   "mserv %d: out of memory\n",(ulong)sock);
      }
      else {
        *arg = sock;
        psVar4 = &clientAddr;
        puVar5 = arg + 2;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          *(undefined8 *)puVar5 = *(undefined8 *)psVar4;
          psVar4 = (sockaddr_storage *)((long)psVar4 + (ulong)bVar6 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar6 * -4 + 2;
        }
        TPJobInit((ThreadPoolJob *)errorBuffer,handle_request,arg);
        TPJobSetFreeFunction((ThreadPoolJob *)errorBuffer,free_handle_request_arg);
        TPJobSetPriority((ThreadPoolJob *)errorBuffer,MED_PRIORITY);
        iVar1 = ThreadPoolAdd(&gMiniServerThreadPool,(ThreadPoolJob *)errorBuffer,(int *)0x0);
        if (iVar1 == 0) {
          return;
        }
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1ef,
                   "mserv %d: cannot schedule request\n",(ulong)sock);
        free(arg);
      }
      sock_close(sock);
    }
  }
  return;
}

Assistant:

static void web_server_accept(SOCKET lsock, fd_set *set)
{
	#ifdef INTERNAL_WEB_SERVER
	SOCKET asock;
	socklen_t clientLen;
	struct sockaddr_storage clientAddr;
	char errorBuffer[ERROR_BUFFER_LEN];

	if (lsock != INVALID_SOCKET && FD_ISSET(lsock, set)) {
		clientLen = sizeof(clientAddr);
		asock = accept(
			lsock, (struct sockaddr *)&clientAddr, &clientLen);
		if (asock == INVALID_SOCKET) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in accept(): %s\n",
				errorBuffer);
		} else {
			schedule_request_job(
				asock, (struct sockaddr *)&clientAddr);
		}
	}
	#endif /* INTERNAL_WEB_SERVER */
}